

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_3chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  uint *puVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    puVar10 = (uint *)(peVar4->field_12).decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    pvVar11 = decode->unpacked_buffer;
    lVar12 = (long)(int)(uVar2 * 6);
    pvVar13 = (void *)((long)pvVar11 + (long)(int)uVar2 * 4);
    pvVar7 = (void *)((long)pvVar11 + (long)(int)uVar2 * 2);
    iVar16 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar17 = 0;
        puVar14 = puVar10;
        do {
          uVar8 = (uint)*(short *)((long)pvVar11 + uVar17 * 2);
          uVar15 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar9 = (uVar9 | uVar15) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar15 | 0x7f800000;
          }
          *puVar14 = uVar9;
          uVar8 = (uint)*(short *)((long)pvVar7 + uVar17 * 2);
          uVar15 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar9 = (uVar9 | uVar15) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar15 | 0x7f800000;
          }
          puVar14[1] = uVar9;
          uVar8 = (uint)*(short *)((long)pvVar13 + uVar17 * 2);
          uVar15 = (uVar8 & 0x7fff) << 0xd;
          uVar9 = uVar8 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar8 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar8 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar9 = (uVar9 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar9 = (uVar9 | uVar15) + 0x38000000;
          }
          else {
            uVar9 = uVar9 | uVar15 | 0x7f800000;
          }
          puVar14[2] = uVar9;
          puVar14 = puVar14 + 3;
          uVar17 = uVar17 + 1;
        } while (uVar2 != uVar17);
      }
      pvVar11 = (void *)((long)pvVar11 + lVar12);
      puVar10 = (uint *)((long)puVar10 + (long)iVar3);
      iVar16 = iVar16 + 1;
      pvVar13 = (void *)((long)pvVar13 + lVar12);
      pvVar7 = (void *)((long)pvVar7 + lVar12);
    } while (iVar16 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in0[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in2[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}